

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O2

char * json2map_setTokenValue(char *jsonString,jsmntok_t *token)

{
  int iVar1;
  void *__dest;
  char *pcVar2;
  long lVar3;
  
  iVar1 = token->start;
  lVar3 = (long)token->end - (long)iVar1;
  __dest = calloc(1,lVar3 + 1);
  pcVar2 = (char *)memcpy(__dest,jsonString + iVar1,(long)(int)lVar3);
  return pcVar2;
}

Assistant:

static char *json2map_setTokenValue(char *jsonString, jsmntok_t *token) {
	DEBUG_TEXT("json2map_setTokenValue(%s, [jsmntok_t *])... ", jsonString);
	char *buffer;
	buffer = calloc(sizeof(char), token->end - token->start + 1);
	memcpy(buffer, jsonString + token->start, token->end - token->start);
	DEBUG_TEXT("json2map_setTokenValue(%s, [jsmntok_t *])... DONE", jsonString);
	return buffer;
}